

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

hash_code llvm::hash_value(APInt *Arg)

{
  ulong uVar1;
  type tVar2;
  ulong uVar3;
  hash_combine_recursive_helper local_90;
  
  if ((ulong)Arg->BitWidth < 0x41) {
    hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_90);
    uVar1 = (Arg->U).VAL >> 0x20 ^ local_90.seed;
    uVar3 = (((Arg->U).VAL & 0xffffffff) * 8 + 8 ^ uVar1) * -0x622015f714c7d297;
    uVar1 = (uVar3 >> 0x2f ^ uVar1 ^ uVar3) * -0x622015f714c7d297;
    return (hash_code)((uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297);
  }
  tVar2 = hashing::detail::hash_combine_range_impl<unsigned_long>
                    ((Arg->U).pVal,(Arg->U).pVal + ((ulong)Arg->BitWidth + 0x3f >> 6));
  return (hash_code)tVar2.value;
}

Assistant:

hash_code llvm::hash_value(const APInt &Arg) {
  if (Arg.isSingleWord())
    return hash_combine(Arg.U.VAL);

  return hash_combine_range(Arg.U.pVal, Arg.U.pVal + Arg.getNumWords());
}